

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::ReleasePages(LargeHeapBlock *this,Recycler *recycler)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  IdleDecommitPageAllocator *this_00;
  char **ppcVar6;
  char *pcVar7;
  PageHeapData *pPVar8;
  long lVar9;
  size_t pageCount;
  DWORD local_2c [2];
  DWORD oldProtect;
  
  if ((this->super_HeapBlock).segment == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x158,"(segment != nullptr)","segment != nullptr");
    if (!bVar3) goto LAB_006e688b;
    *puVar5 = 0;
  }
  this_00 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this->heapInfo);
  pcVar7 = (this->super_HeapBlock).address;
  pageCount = this->pageCount;
  pPVar8 = this->pageHeapData;
  if ((pPVar8 != (PageHeapData *)0x0) && (pPVar8->pageHeapMode != PageHeapModeOff)) {
    uVar1 = pPVar8->actualPageCount;
    lVar9 = uVar1 - pageCount;
    if (pPVar8->isGuardPageDecommitted == true) {
      if ((this_00->super_PageAllocator).disablePageReuse == false) {
        pcVar7 = (char *)VirtualAlloc(pPVar8->guardPageAddress,lVar9 * 0x1000,0x1000,4);
        pPVar8 = this->pageHeapData;
      }
      else {
        pcVar7 = (char *)0x0;
      }
      if ((pcVar7 != pPVar8->guardPageAddress) ||
         ((this_00->super_PageAllocator).disablePageReuse != false)) {
        VirtualFree(pPVar8->objectPageAddr,this->pageCount << 0xc,0x4000);
        goto LAB_006e682c;
      }
    }
    else {
      BVar4 = VirtualProtect(pPVar8->guardPageAddress,lVar9 * 0x1000,4,local_2c);
      if ((BVar4 == 0) || (local_2c[0] != 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x17e,"(ret && oldProtect == 0x01)","ret && oldProtect == PAGE_NOACCESS"
                          );
        if (!bVar3) {
LAB_006e688b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pPVar8 = this->pageHeapData;
    }
    ppcVar6 = &pPVar8->objectPageAddr;
    if (pPVar8->pageHeapMode == PageHeapModeBlockStart) {
      ppcVar6 = &pPVar8->guardPageAddress;
    }
    pcVar7 = *ppcVar6;
    pageCount = (ulong)uVar1;
  }
  if (pcVar7 != (char *)0x0) {
    memset(pcVar7,0xfe,pageCount << 0xc);
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Release(&this_00->super_PageAllocator,pcVar7,pageCount,(this->super_HeapBlock).segment);
LAB_006e682c:
  (this->super_HeapBlock).segment = (Segment *)0x0;
  return;
}

Assistant:

void
LargeHeapBlock::ReleasePages(Recycler * recycler)
{
    Assert(segment != nullptr);

    IdleDecommitPageAllocator* pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    char* blockStartAddress = this->address;
    size_t realPageCount = this->pageCount;
#ifdef RECYCLER_PAGE_HEAP
    if (InPageHeapMode())
    {
        size_t guardPageCount = pageHeapData->actualPageCount - this->pageCount;
        realPageCount = pageHeapData->actualPageCount;

        if (pageHeapData->isGuardPageDecommitted)
        {
            void* addr = nullptr;
#ifdef RECYCLER_NO_PAGE_REUSE
            if (!pageAllocator->IsPageReuseDisabled())
#endif
            {
                addr = VirtualAlloc(pageHeapData->guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, MEM_COMMIT, PAGE_READWRITE);
            }

            if (addr != pageHeapData->guardPageAddress // failed to re-commit guard page
#ifdef RECYCLER_NO_PAGE_REUSE
                || pageAllocator->IsPageReuseDisabled()
#endif
                )
            {
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
                VirtualFree((char*)pageHeapData->objectPageAddr, this->pageCount* AutoSystemInfo::PageSize, MEM_DECOMMIT);
                RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockPageSize, pageCount * AutoSystemInfo::PageSize);
                this->segment = nullptr;
                return;
            }
        }
        else
        {
            DWORD oldProtect;
            BOOL ret = ::VirtualProtect(pageHeapData->guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, PAGE_READWRITE, &oldProtect);
            Assert(ret && oldProtect == PAGE_NOACCESS);
        }

        blockStartAddress = pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart ?
            pageHeapData->guardPageAddress : pageHeapData->objectPageAddr;

    }
#endif

#ifdef RECYCLER_FREE_MEM_FILL
    if(blockStartAddress != nullptr)
    {
        memset(blockStartAddress, DbgMemFill, AutoSystemInfo::PageSize * realPageCount);
    }
#endif
    pageAllocator->Release(blockStartAddress, realPageCount, segment);
    RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockPageSize, pageCount * AutoSystemInfo::PageSize);
    this->segment = nullptr;
}